

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

bool __thiscall
libcellml::Generator::GeneratorImpl::isXorOperator(GeneratorImpl *this,AnalyserEquationAstPtr *ast)

{
  bool bVar1;
  Type TVar2;
  
  TVar2 = AnalyserEquationAst::type
                    ((ast->
                     super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr);
  if (TVar2 == XOR) {
    bVar1 = GeneratorProfile::hasXorOperator
                      ((this->mProfile).
                       super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    return bVar1;
  }
  return false;
}

Assistant:

bool Generator::GeneratorImpl::isXorOperator(const AnalyserEquationAstPtr &ast) const
{
    return (ast->type() == AnalyserEquationAst::Type::XOR)
           && mProfile->hasXorOperator();
}